

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

Offset<flatbuffers::String> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateSharedString
          (FlatBufferBuilderImpl<false> *this,char *str,size_t len)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  *this_00;
  reference pOVar4;
  _Self local_60;
  _Self local_58;
  iterator it;
  Offset<flatbuffers::String> off;
  size_t size_before_string;
  StringOffsetCompare local_30;
  size_t local_28;
  size_t len_local;
  char *str_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_28 = len;
  len_local = (size_t)str;
  str_local = (char *)this;
  if (this->string_pool == (StringOffsetMap *)0x0) {
    this_00 = (set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
               *)operator_new(0x30);
    size_before_string._2_1_ = 1;
    StringOffsetCompare::StringOffsetCompare(&local_30,&this->buf_);
    std::allocator<flatbuffers::Offset<flatbuffers::String>_>::allocator
              ((allocator<flatbuffers::Offset<flatbuffers::String>_> *)
               ((long)&size_before_string + 3));
    std::
    set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::set(this_00,&local_30,
          (allocator<flatbuffers::Offset<flatbuffers::String>_> *)((long)&size_before_string + 3));
    size_before_string._2_1_ = 0;
    this->string_pool = this_00;
    std::allocator<flatbuffers::Offset<flatbuffers::String>_>::~allocator
              ((allocator<flatbuffers::Offset<flatbuffers::String>_> *)
               ((long)&size_before_string + 3));
  }
  uVar2 = vector_downward<unsigned_int>::size(&this->buf_);
  it._M_node._4_4_ = CreateString<flatbuffers::Offset>(this,(char *)len_local,local_28);
  local_58._M_node =
       (_Base_ptr)
       std::
       set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
       ::find(this->string_pool,(key_type *)((long)&it._M_node + 4));
  local_60._M_node =
       (_Base_ptr)
       std::
       set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
       ::end(this->string_pool);
  bVar1 = std::operator!=(&local_58,&local_60);
  if (bVar1) {
    uVar3 = vector_downward<unsigned_int>::size(&this->buf_);
    vector_downward<unsigned_int>::pop(&this->buf_,(ulong)uVar3 - (ulong)uVar2);
    pOVar4 = std::_Rb_tree_const_iterator<flatbuffers::Offset<flatbuffers::String>_>::operator*
                       (&local_58);
    this_local._4_4_ = pOVar4->o;
  }
  else {
    std::
    set<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::insert(this->string_pool,(value_type *)((long)&it._M_node + 4));
    this_local._4_4_ = it._M_node._4_4_;
  }
  return (Offset<flatbuffers::String>)this_local._4_4_;
}

Assistant:

Offset<String> CreateSharedString(const char *str, size_t len) {
    FLATBUFFERS_ASSERT(FLATBUFFERS_GENERAL_HEAP_ALLOC_OK);
    if (!string_pool) {
      string_pool = new StringOffsetMap(StringOffsetCompare(buf_));
    }

    const size_t size_before_string = buf_.size();
    // Must first serialize the string, since the set is all offsets into
    // buffer.
    const Offset<String> off = CreateString<Offset>(str, len);
    auto it = string_pool->find(off);
    // If it exists we reuse existing serialized data!
    if (it != string_pool->end()) {
      // We can remove the string we serialized.
      buf_.pop(buf_.size() - size_before_string);
      return *it;
    }
    // Record this string for future use.
    string_pool->insert(off);
    return off;
  }